

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto.cpp
# Opt level: O1

gfield * __thiscall gfield::div2<13>(gfield *this,bigint<13> *x)

{
  if ((0 < (this->super_gfint).len) && (((this->super_gfint).digits[0] & 1) != 0)) {
    bigint<13>::add<13,13>(&this->super_gfint,x,&P.super_gfint);
    x = &this->super_gfint;
  }
  bigint<13>::rshift<13>(&this->super_gfint,x,1);
  return this;
}

Assistant:

gfield &div2(const bigint<X_DIGITS> &x)
    {
        if(hasbit(0)) { gfint::add(x, P); rshift(1); }
        else rshift(x, 1);
        return *this;
    }